

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::SoPlexBase<double>::getRowViolation
          (SoPlexBase<double> *this,double *maxviol,double *sumviol)

{
  bool bVar1;
  double *pdVar2;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  SPxLPBase<double> *this_00;
  SoPlexBase<double> *this_01;
  double dVar3;
  double viol;
  double rhs;
  double lhs;
  int i;
  VectorBase<double> activity;
  VectorBase<double> *primal;
  SoPlexBase<double> *in_stack_ffffffffffffff70;
  int i_00;
  SPxLPBase<double> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_50;
  undefined1 local_40 [24];
  long local_28;
  double *local_20;
  double *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = isPrimalFeasible(in_stack_ffffffffffffff70);
  if (bVar1) {
    _syncRealSolution(in_stack_ffffffffffffff70);
    local_28 = in_RDI + 0x4e68;
    numRows((SoPlexBase<double> *)0x4244c1);
    VectorBase<double>::VectorBase
              ((VectorBase<double> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    (**(code **)(**(long **)(in_RDI + 0x1ce0) + 0x230))
              (*(long **)(in_RDI + 0x1ce0),local_28,local_40,1);
    *local_18 = 0.0;
    *local_20 = 0.0;
    local_50 = numRows((SoPlexBase<double> *)0x424520);
    while( true ) {
      i_00 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
      local_50 = local_50 + -1;
      if (local_50 < 0) break;
      this_00 = (SPxLPBase<double> *)SPxLPBase<double>::lhsUnscaled(in_stack_ffffffffffffff78,i_00);
      in_stack_ffffffffffffff78 = this_00;
      this_01 = (SoPlexBase<double> *)SPxLPBase<double>::rhsUnscaled(this_00,i_00);
      in_stack_ffffffffffffff70 = this_01;
      pdVar2 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)this_01,(int)((ulong)this_00 >> 0x20));
      dVar3 = (double)this_00 - *pdVar2;
      if ((0.0 < dVar3) && (*local_20 = dVar3 + *local_20, *local_18 <= dVar3 && dVar3 != *local_18)
         ) {
        *local_18 = dVar3;
      }
      pdVar2 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_ffffffffffffff70,
                          (int)((ulong)this_00 >> 0x20));
      dVar3 = *pdVar2 - (double)this_01;
      if ((0.0 < dVar3) && (*local_20 = dVar3 + *local_20, *local_18 <= dVar3 && dVar3 != *local_18)
         ) {
        *local_18 = dVar3;
      }
    }
    local_1 = 1;
    VectorBase<double>::~VectorBase((VectorBase<double> *)0x4246ab);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool SoPlexBase<R>::getRowViolation(R& maxviol, R& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   _syncRealSolution();
   VectorBase<R>& primal = _solReal._primal;
   assert(primal.dim() == numCols());

   VectorBase<R> activity(numRows());
   _realLP->computePrimalActivity(primal, activity, true);
   maxviol = 0.0;
   sumviol = 0.0;

   for(int i = numRows() - 1; i >= 0; i--)
   {
      R lhs = _realLP->lhsUnscaled(i);
      R rhs = _realLP->rhsUnscaled(i);

      R viol = lhs - activity[i];

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }

      viol = activity[i] - rhs;

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }
   }

   return true;
}